

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::addStructType
          (UniformCollection *this,StructType *type)

{
  StructType *local_8;
  
  local_8 = type;
  std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::push_back
            (&this->m_structTypes,&local_8);
  return;
}

Assistant:

void				addStructType		(const StructType* const type)	{ m_structTypes.push_back(type);	}